

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceListTestCase::verifyResourceIndexQuery
          (ResourceListTestCase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *resourceList,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *referenceResources,GLuint program)

{
  undefined4 uVar1;
  size_t __n;
  _func_int **__n_00;
  long lVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  int iVar5;
  uint uVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  pointer pbVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  pointer pbVar12;
  string queryString;
  byte local_1fc;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  long local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1c0 = CONCAT44(extraout_var,iVar5);
  uVar1 = *(undefined4 *)
           (Functional::(anonymous_namespace)::
            getProgramInterfaceGLEnum(deqp::gles31::Functional::ProgramInterface)::s_enums +
           (long)(int)this->m_programInterface * 4);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "Verifying GetProgramResourceIndex returns correct indices for resource names.",0x4d);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pbVar12 = (referenceResources->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar8 = (referenceResources->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)pbVar8 - (long)pbVar12) >> 5) < 1) {
    local_1fc = 0;
  }
  else {
    lVar9 = 0;
    lVar11 = 0;
    local_1fc = 0;
    do {
      lVar2 = local_1c0;
      uVar6 = (**(code **)(local_1c0 + 0x9a8))
                        (program,uVar1,*(undefined8 *)((long)&(pbVar12->_M_dataplus)._M_p + lVar9));
      dVar7 = (**(code **)(lVar2 + 0x800))();
      glu::checkError(dVar7,"query resource index",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x449);
      if (uVar6 == 0xffffffff) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Error, for active resource \"",0x1c);
        pbVar8 = (referenceResources->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,*(char **)((long)&(pbVar8->_M_dataplus)._M_p + lVar9),
                   *(long *)((long)&pbVar8->_M_string_length + lVar9));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"\" got index GL_INVALID_INDEX.",0x1d);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0155458d:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        local_1fc = 1;
      }
      else {
        pbVar8 = (resourceList->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(resourceList->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) >> 5) <=
            (int)uVar6) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Error, for active resource \"",0x1c);
          pbVar8 = (referenceResources->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,*(char **)((long)&(pbVar8->_M_dataplus)._M_p + lVar9),
                     *(long *)((long)&pbVar8->_M_string_length + lVar9));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"\" got index ",0xc);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8," (larger or equal to GL_ACTIVE_RESOURCES).",0x2a);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_0155458d;
        }
        pbVar12 = (referenceResources->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        __n = pbVar8[uVar6]._M_string_length;
        if ((__n != *(size_t *)((long)&pbVar12->_M_string_length + lVar9)) ||
           ((__n != 0 &&
            (iVar5 = bcmp(pbVar8[uVar6]._M_dataplus._M_p,
                          *(void **)((long)&(pbVar12->_M_dataplus)._M_p + lVar9),__n), iVar5 != 0)))
           ) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Error, for active resource \"",0x1c);
          pbVar8 = (referenceResources->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,*(char **)((long)&(pbVar8->_M_dataplus)._M_p + lVar9),
                     *(long *)((long)&pbVar8->_M_string_length + lVar9));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"\" got index (index = ",0x15);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,") of another resource (",0x17);
          pbVar8 = (resourceList->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,pbVar8[uVar6]._M_dataplus._M_p,
                     pbVar8[uVar6]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,").",2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_0155458d;
        }
      }
      lVar11 = lVar11 + 1;
      pbVar12 = (referenceResources->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar8 = (referenceResources->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar9 = lVar9 + 0x20;
    } while (lVar11 < (int)((ulong)((long)pbVar8 - (long)pbVar12) >> 5));
  }
  if ((this->m_programInterface != PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING) &&
     (0 < (int)((ulong)((long)pbVar8 - (long)pbVar12) >> 5))) {
    lVar11 = 0;
    lVar9 = 0;
    do {
      local_1b0 = (undefined1  [8])local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"[0]","");
      bVar4 = de::endsWith((string *)((long)&(pbVar12->_M_dataplus)._M_p + lVar11),
                           (string *)local_1b0);
      if (local_1b0 != (undefined1  [8])local_1a0) {
        operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
      }
      if (bVar4) {
        std::__cxx11::string::substr
                  ((ulong)&local_1e0,
                   (long)&(((referenceResources->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar11)
        ;
        uVar6 = (**(code **)(local_1c0 + 0x9a8))(program,uVar1,local_1e0);
        dVar7 = (**(code **)(local_1c0 + 0x800))();
        glu::checkError(dVar7,"query resource index",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                        ,0x466);
        if (uVar6 == 0xffffffff) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Error, query for \"",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,(char *)local_1e0,local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"\" resulted in index GL_INVALID_INDEX.",0x25);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0155493a:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          local_1fc = 1;
        }
        else {
          pbVar8 = (resourceList->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((int)((ulong)((long)(resourceList->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) >> 5)
              <= (int)uVar6) {
            local_1b0 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"Error, query for \"",0x12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,(char *)local_1e0,local_1d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"\" resulted in index ",0x14);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8," (larger or equal to GL_ACTIVE_RESOURCES).",0x2a);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_0155493a;
          }
          local_1b0 = (undefined1  [8])local_1a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b0,local_1e0,(long)local_1e0 + local_1d8);
          std::__cxx11::string::append((char *)local_1b0);
          auVar3 = local_1b0;
          uVar10 = (ulong)uVar6;
          pbVar8 = pbVar8 + uVar10;
          __n_00 = (_func_int **)pbVar8->_M_string_length;
          local_1b8 = uVar10;
          if (__n_00 == local_1a8) {
            if (__n_00 == (_func_int **)0x0) {
              bVar4 = false;
            }
            else {
              iVar5 = bcmp((pbVar8->_M_dataplus)._M_p,(void *)local_1b0,(size_t)__n_00);
              bVar4 = iVar5 != 0;
            }
          }
          else {
            bVar4 = true;
          }
          if (auVar3 != (undefined1  [8])local_1a0) {
            operator_delete((void *)auVar3,local_1a0[0]._M_allocated_capacity + 1);
          }
          if (bVar4) {
            local_1b0 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"Error, query for \"",0x12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,(char *)local_1e0,local_1d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"\" got index (index = ",0x15);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,") of another resource (\"",0x18);
            pbVar8 = (resourceList->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,pbVar8[uVar10]._M_dataplus._M_p,
                       pbVar8[uVar10]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\").",3);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_0155493a;
          }
        }
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
      }
      lVar9 = lVar9 + 1;
      pbVar12 = (referenceResources->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x20;
    } while (lVar9 < (int)((ulong)((long)(referenceResources->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12
                                  ) >> 5));
  }
  return (bool)(~local_1fc & 1);
}

Assistant:

bool ResourceListTestCase::verifyResourceIndexQuery (const std::vector<std::string>& resourceList, const std::vector<std::string>& referenceResources, glw::GLuint program)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glw::GLenum		programInterface	= getProgramInterfaceGLEnum(m_programInterface);
	bool					error				= false;

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying GetProgramResourceIndex returns correct indices for resource names." << tcu::TestLog::EndMessage;

	for (int ndx = 0; ndx < (int)referenceResources.size(); ++ndx)
	{
		const glw::GLuint index = gl.getProgramResourceIndex(program, programInterface, referenceResources[ndx].c_str());
		GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

		if (index == GL_INVALID_INDEX)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, for active resource \"" << referenceResources[ndx] << "\" got index GL_INVALID_INDEX." << tcu::TestLog::EndMessage;
			error = true;
		}
		else if ((int)index >= (int)resourceList.size())
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, for active resource \"" << referenceResources[ndx] << "\" got index " << index << " (larger or equal to GL_ACTIVE_RESOURCES)." << tcu::TestLog::EndMessage;
			error = true;
		}
		else if (resourceList[index] != referenceResources[ndx])
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, for active resource \"" << referenceResources[ndx] << "\" got index (index = " << index << ") of another resource (" << resourceList[index] << ")." << tcu::TestLog::EndMessage;
			error = true;
		}
	}

	// Query for "name" should match "name[0]" except for XFB

	if (m_programInterface != PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING)
	{
		for (int ndx = 0; ndx < (int)referenceResources.size(); ++ndx)
		{
			if (de::endsWith(referenceResources[ndx], "[0]"))
			{
				const std::string	queryString	= referenceResources[ndx].substr(0, referenceResources[ndx].length()-3);
				const glw::GLuint	index		= gl.getProgramResourceIndex(program, programInterface, queryString.c_str());
				GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

				if (index == GL_INVALID_INDEX)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for \"" << queryString << "\" resulted in index GL_INVALID_INDEX." << tcu::TestLog::EndMessage;
					error = true;
				}
				else if ((int)index >= (int)resourceList.size())
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for \"" << queryString << "\" resulted in index " << index << " (larger or equal to GL_ACTIVE_RESOURCES)." << tcu::TestLog::EndMessage;
					error = true;
				}
				else if (resourceList[index] != queryString + "[0]")
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for \"" << queryString << "\" got index (index = " << index << ") of another resource (\"" << resourceList[index] << "\")." << tcu::TestLog::EndMessage;
					error = true;
				}
			}
		}
	}

	return !error;
}